

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void jpgd::jpeg_decoder::decode_block_dc_first
               (jpeg_decoder *pD,int component_id,int block_x,int block_y)

{
  uint num_bits;
  uint uVar1;
  jpgd_block_t *pjVar2;
  
  pjVar2 = coeff_buf_getp(pD,pD->m_dc_coeffs[component_id],block_x,block_y);
  num_bits = huff_decode(pD,pD->m_pHuff_tabs[pD->m_comp_dc_tab[component_id]]);
  if (num_bits == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = get_bits_no_markers(pD,num_bits);
    if ((int)uVar1 < *(int *)(s_extend_test + (ulong)(num_bits & 0xf) * 4)) {
      uVar1 = uVar1 + *(int *)(s_extend_offset + (ulong)(num_bits & 0xf) * 4);
    }
  }
  uVar1 = uVar1 + pD->m_last_dc_val[component_id];
  pD->m_last_dc_val[component_id] = uVar1;
  *pjVar2 = (jpgd_block_t)(uVar1 << ((byte)pD->m_successive_low & 0x1f));
  return;
}

Assistant:

void jpeg_decoder::decode_block_dc_first(jpeg_decoder *pD, int component_id, int block_x, int block_y)
{
  int s, r;
  jpgd_block_t *p = pD->coeff_buf_getp(pD->m_dc_coeffs[component_id], block_x, block_y);

  if ((s = pD->huff_decode(pD->m_pHuff_tabs[pD->m_comp_dc_tab[component_id]])) != 0)
  {
    r = pD->get_bits_no_markers(s);
    s = JPGD_HUFF_EXTEND(r, s);
  }

  pD->m_last_dc_val[component_id] = (s += pD->m_last_dc_val[component_id]);

  p[0] = static_cast<jpgd_block_t>(s << pD->m_successive_low);
}